

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>>
               (char *label_id,GetterXsYs<float> *getter1,GetterXsYRef<float> *getter2)

{
  double dVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImU32 col;
  long lVar5;
  ImDrawList *DrawList;
  int iVar6;
  int iVar7;
  int iVar8;
  ImPlotPoint p2;
  ImPlotPoint local_78;
  undefined1 local_68 [3] [16];
  
  bVar3 = BeginItem(label_id,1);
  if (bVar3) {
    if (GImPlot->FitThisFrame == true) {
      iVar8 = getter1->Count;
      iVar6 = getter2->Count;
      iVar7 = iVar6;
      if (iVar8 < iVar6) {
        iVar7 = iVar8;
      }
      if (0 < iVar7) {
        iVar7 = 0;
        do {
          lVar5 = (long)(((getter1->Offset + iVar7) % iVar8 + iVar8) % iVar8) *
                  (long)getter1->Stride;
          dVar1 = (double)*(float *)((long)getter1->Ys + lVar5);
          local_68[0]._8_4_ = SUB84(dVar1,0);
          local_68[0]._0_8_ = (double)*(float *)((long)getter1->Xs + lVar5);
          local_68[0]._12_4_ = (int)((ulong)dVar1 >> 0x20);
          local_78.x = (double)*(float *)((long)getter2->Xs +
                                         (long)(((getter2->Offset + iVar7) % iVar6 + iVar6) % iVar6)
                                         * (long)getter2->Stride);
          local_78.y = getter2->YRef;
          FitPoint((ImPlotPoint *)local_68);
          FitPoint(&local_78);
          iVar7 = iVar7 + 1;
          iVar8 = getter1->Count;
          iVar6 = getter2->Count;
          iVar4 = iVar6;
          if (iVar8 < iVar6) {
            iVar4 = iVar8;
          }
        } while (iVar7 < iVar4);
      }
    }
    pIVar2 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar2->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 1);
      iVar8 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar8]) {
      case 0:
        local_78.x = (double)CONCAT44(local_78.x._4_4_,iVar8);
        ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
                          *)local_68,getter1,getter2,(TransformerLinLin *)&local_78,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
                    *)local_68,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_78.x = (double)CONCAT44(local_78.x._4_4_,iVar8);
        ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLin>
                          *)local_68,getter1,getter2,(TransformerLogLin *)&local_78,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLin>
                    *)local_68,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_78.x = (double)CONCAT44(local_78.x._4_4_,iVar8);
        ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLog>
                          *)local_68,getter1,getter2,(TransformerLinLog *)&local_78,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLog>
                    *)local_68,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_78.x = (double)CONCAT44(local_78.x._4_4_,iVar8);
        ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
                          *)local_68,getter1,getter2,(TransformerLogLog *)&local_78,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
                    *)local_68,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar2 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar2->NextItemData);
    pIVar2->PreviousItem = pIVar2->CurrentItem;
    pIVar2->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < ImMin(getter1.Count, getter2.Count); ++i) {
                ImPlotPoint p1 = getter1(i);
                ImPlotPoint p2 = getter2(i);
                FitPoint(p1);
                FitPoint(p2);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}